

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O1

wchar_t reconfigure_for_term_if_necessary(_Bool update_names,player *p,equippable_summary *s)

{
  undefined8 *puVar1;
  wchar_t wVar2;
  equippable *peVar3;
  int iVar4;
  wchar_t wVar5;
  char *__s;
  size_t sVar6;
  long lVar7;
  long lVar8;
  size_t length;
  wchar_t nrow;
  wchar_t ncol;
  wchar_t local_40;
  wchar_t local_3c;
  wchar_t local_38;
  wchar_t local_34;
  
  Term_get_size(&local_34,&local_40);
  if ((s->term_ncol != local_34) || (local_38 = L'\0', s->term_nrow != local_40)) {
    iVar4 = local_40 - s->irow_combined_equip;
    wVar2 = iVar4 + L'\xfffffffe';
    s->maxpage = wVar2;
    local_38 = L'\x01';
    if (2 < iVar4) {
      wVar5 = L'\0';
      local_38 = L'\0';
      if (wVar2 < s->npage) {
        s->npage = wVar2;
        local_38 = wVar5;
        if (s->work_sel != L'\xffffffff') {
          if (wVar2 <= (s->work_sel - s->ifirst) * s->indinc) {
            s->work_sel = s->indinc * (iVar4 + -3) + s->ifirst;
          }
        }
      }
    }
    wVar2 = s->propcats[4].n;
    wVar5 = ~s->icol_name + (local_34 - s->nprop) + wVar2;
    if (wVar5 < L'\x10') {
      wVar5 = wVar5 + s->propcats[3].n;
      if (wVar5 < L'\x10') {
        wVar5 = wVar5 + s->propcats[2].n;
        s->nview = L'\x03';
        lVar7 = 0;
        do {
          *(undefined4 *)((long)s->propcats[0].nvw + lVar7) =
               *(undefined4 *)((long)s->propcats[0].nvw + lVar7 + -8);
          puVar1 = (undefined8 *)((long)s->propcats[0].nvw + lVar7 + 4);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)s->propcats[0].ivw + lVar7 + 8) = 0;
          lVar7 = lVar7 + 0x38;
        } while (lVar7 == 0x38);
        lVar7 = 0;
        do {
          *(undefined4 *)((long)s->propcats[2].nvw + lVar7) = 0;
          *(undefined4 *)((long)s->propcats[2].nvw + lVar7 + 4) =
               *(undefined4 *)((long)s->propcats[2].nvw + lVar7 + -8);
          puVar1 = (undefined8 *)((long)s->propcats[2].nvw + lVar7 + 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar7 = lVar7 + 0x38;
        } while (lVar7 != 0x70);
        if (wVar5 < L'\x10') {
          local_38 = L'\x01';
        }
        s->propcats[4].nvw[0] = L'\0';
        s->propcats[4].nvw[1] = L'\0';
        s->propcats[4].nvw[2] = wVar2;
        s->propcats[4].ivw[0] = L'\0';
        s->propcats[4].ivw[1] = L'\0';
        s->propcats[4].ivw[2] = L'\0';
      }
      else {
        s->nview = L'\x02';
        lVar7 = 0x4c;
        do {
          *(undefined4 *)((long)s->propcats[0].nvw + lVar7 + -0x4c) =
               *(undefined4 *)((long)s->propcats[0].nvw + lVar7 + -0x54);
          puVar1 = (undefined8 *)((long)s->propcats[0].nvw + lVar7 + -0x48);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)s->propcats[0].nvw + lVar7 + -0x38) = 0;
          lVar7 = lVar7 + 0x38;
        } while (lVar7 != 0xf4);
        lVar7 = 0;
        do {
          *(undefined4 *)((long)s->propcats[3].nvw + lVar7) = 0;
          *(undefined4 *)((long)s->propcats[3].nvw + lVar7 + 4) =
               *(undefined4 *)((long)s->propcats[3].nvw + lVar7 + -8);
          puVar1 = (undefined8 *)((long)s->propcats[3].nvw + lVar7 + 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar7 = lVar7 + 0x38;
        } while (lVar7 != 0x70);
      }
    }
    else {
      s->nview = L'\x02';
      lVar7 = 0;
      do {
        *(undefined4 *)((long)s->propcats[0].nvw + lVar7) =
             *(undefined4 *)((long)s->propcats[0].nvw + lVar7 + -8);
        puVar1 = (undefined8 *)((long)s->propcats[0].nvw + lVar7 + 4);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)s->propcats[0].ivw + lVar7 + 8) = 0;
        lVar7 = lVar7 + 0x38;
      } while (lVar7 != 0xe0);
      s->propcats[4].nvw[0] = L'\0';
      s->propcats[4].nvw[1] = wVar2;
      *(undefined8 *)(s->propcats[4].nvw + 2) = 0;
      s->propcats[4].ivw[1] = L'\0';
      s->propcats[4].ivw[2] = L'\0';
    }
    if (s->nview <= s->iview) {
      s->iview = s->nview + L'\xffffffff';
    }
    local_3c = L'\x14';
    if (wVar5 < L'\x14') {
      local_3c = wVar5;
    }
    if ((update_names && local_3c != s->nshortnm) && (L'\0' < s->nitems)) {
      length = (size_t)local_3c;
      lVar8 = 0;
      lVar7 = 0;
      do {
        string_free(*(char **)((long)&s->items->short_name + lVar8));
        __s = set_short_name(*(object **)((long)&s->items->obj + lVar8),length,p);
        peVar3 = s->items;
        *(char **)((long)&peVar3->short_name + lVar8) = __s;
        sVar6 = strlen(__s);
        *(int *)((long)&peVar3->nmlen + lVar8) = (int)sVar6;
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x38;
      } while (lVar7 < s->nitems);
    }
    s->nshortnm = local_3c;
    s->term_ncol = local_34;
    s->term_nrow = local_40;
  }
  return local_38;
}

Assistant:

static int reconfigure_for_term_if_necessary(bool update_names,
	const struct player *p, struct equippable_summary *s)
{
	int result = 0;
	int min_length = 16;
	int ncol, nrow, length, i;

	Term_get_size(&ncol, &nrow);
	if (s->term_ncol == ncol && s->term_nrow == nrow) {
		return result;
	}

	/*
	 * Have s->irow_combined_equip + 1 rows of a header and one row, for
	 * prompts, of a footer.
	 */
	s->maxpage = nrow - s->irow_combined_equip - 2;
	if (s->maxpage < 1) {
		result = 1;
	} else if (s->npage > s->maxpage) {
		s->npage = s->maxpage;
		if (s->work_sel != -1 &&
			(s->work_sel - s->ifirst) * s->indinc >= s->npage) {
			s->work_sel = s->ifirst + (s->npage - 1) * s->indinc;
		}
	}

	/*
	 * Leave a space between the name and the properties.  Don't include
	 * the core stat modifiers in the first view.
	 */
	length = ncol - s->nprop + s->propcats[N_ELEMENTS(s->propcats) - 1].n -
		1 - s->icol_name;
	if (length < min_length) {
		/* Try shifting the other modifiers to the second view. */
		length += s->propcats[N_ELEMENTS(s->propcats) - 2].n;
		if (length < min_length) {
			/* Try a three view layout. */
			length += s->propcats[N_ELEMENTS(s->propcats) - 3].n;
			if (length < min_length) {
				/* Give up. */
				result = 1;
			}
			s->nview = 3;
			for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 3; ++i) {
				s->propcats[i].nvw[0] = s->propcats[i].n;
				s->propcats[i].nvw[1] = 0;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			for (i = (int)N_ELEMENTS(s->propcats) - 3;
				i < (int)N_ELEMENTS(s->propcats) - 1; ++i) {
				s->propcats[i].nvw[0] = 0;
				s->propcats[i].nvw[1] = s->propcats[i].n;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[0] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[1] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[2] =
				s->propcats[N_ELEMENTS(s->propcats) - 1].n;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[0] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[1] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[2] = 0;
		} else {
			s->nview = 2;
			for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 2; ++i) {
				s->propcats[i].nvw[0] = s->propcats[i].n;
				s->propcats[i].nvw[1] = 0;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			for (i = (int)N_ELEMENTS(s->propcats) - 2;
				i < (int)N_ELEMENTS(s->propcats); ++i) {
				s->propcats[i].nvw[0] = 0;
				s->propcats[i].nvw[1] = s->propcats[i].n;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
		}
	} else {
		s->nview = 2;
		for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 1; ++i) {
			s->propcats[i].nvw[0] = s->propcats[i].n;
			s->propcats[i].nvw[1] = 0;
			s->propcats[i].nvw[2] = 0;
			s->propcats[i].ivw[0] = 0;
			s->propcats[i].ivw[1] = 0;
			s->propcats[i].ivw[2] = 0;
		}
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[0] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[1] =
			s->propcats[N_ELEMENTS(s->propcats) - 1].n;
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[2] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[0] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[1] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[2] = 0;
	}
	if (s->iview >= s->nview) {
		s->iview = s->nview - 1;
	}
	if (length > 20) {
		length = 20;
	}
	if (length != s->nshortnm && update_names) {
		for (i = 0; i < s->nitems; ++i) {
			string_free(s->items[i].short_name);
			s->items[i].short_name =
				set_short_name(s->items[i].obj, length, p);
			s->items[i].nmlen =
				(int)strlen(s->items[i].short_name);
		}
	}
	s->nshortnm = length;

	s->term_ncol = ncol;
	s->term_nrow = nrow;

	return result;
}